

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_node.c
# Opt level: O0

void NJDNode_set_pos(NJDNode *node,char *str)

{
  size_t sVar1;
  char *pcVar2;
  char *in_RSI;
  long in_RDI;
  
  if (*(long *)(in_RDI + 8) != 0) {
    free(*(void **)(in_RDI + 8));
  }
  if ((in_RSI != (char *)0x0) && (sVar1 = strlen(in_RSI), sVar1 != 0)) {
    pcVar2 = strdup(in_RSI);
    *(char **)(in_RDI + 8) = pcVar2;
    return;
  }
  *(undefined8 *)(in_RDI + 8) = 0;
  return;
}

Assistant:

void NJDNode_set_pos(NJDNode * node, const char *str)
{
   if (node->pos != NULL)
      free(node->pos);
   if (str == NULL || strlen(str) == 0)
      node->pos = NULL;
   else
      node->pos = strdup(str);
}